

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

int spki_table_search_by_ski
              (spki_table *spki_table,uint8_t *ski,spki_record **result,uint *result_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  spki_record *psVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  tommy_list ptVar12;
  long in_FS_OFFSET;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  bVar13 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  ptVar12 = spki_table->list;
  iVar9 = 0;
  if (ptVar12 != (tommy_list)0x0) {
    do {
      puVar4 = (uint8_t *)ptVar12->data;
      auVar14[0] = -(*ski == *puVar4);
      auVar14[1] = -(ski[1] == puVar4[1]);
      auVar14[2] = -(ski[2] == puVar4[2]);
      auVar14[3] = -(ski[3] == puVar4[3]);
      auVar14[4] = -(ski[4] == puVar4[4]);
      auVar14[5] = -(ski[5] == puVar4[5]);
      auVar14[6] = -(ski[6] == puVar4[6]);
      auVar14[7] = -(ski[7] == puVar4[7]);
      auVar14[8] = -(ski[8] == puVar4[8]);
      auVar14[9] = -(ski[9] == puVar4[9]);
      auVar14[10] = -(ski[10] == puVar4[10]);
      auVar14[0xb] = -(ski[0xb] == puVar4[0xb]);
      auVar14[0xc] = -(ski[0xc] == puVar4[0xc]);
      auVar14[0xd] = -(ski[0xd] == puVar4[0xd]);
      auVar14[0xe] = -(ski[0xe] == puVar4[0xe]);
      auVar14[0xf] = -(ski[0xf] == puVar4[0xf]);
      uVar1 = *(undefined4 *)(puVar4 + 0x10);
      uVar2 = *(undefined4 *)(ski + 0x10);
      auVar15[0] = -((char)uVar2 == (char)uVar1);
      auVar15[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
      auVar15[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
      auVar15[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
      auVar15[4] = 0xff;
      auVar15[5] = 0xff;
      auVar15[6] = 0xff;
      auVar15[7] = 0xff;
      auVar15[8] = 0xff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      auVar15 = auVar15 & auVar14;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        uVar8 = *result_size;
        *result_size = uVar8 + 1;
        psVar6 = (spki_record *)lrtr_realloc(*result,(ulong)(uVar8 + 1) << 7);
        if (psVar6 == (spki_record *)0x0) {
          lrtr_free(*result);
          iVar9 = -1;
          goto LAB_0010489e;
        }
        *result = psVar6;
        uVar8 = *result_size - 1;
        psVar6[uVar8].asn = *(uint32_t *)(puVar4 + 0x14);
        psVar6[uVar8].socket = *(rtr_socket **)(puVar4 + 0x78);
        *(undefined4 *)(psVar6[uVar8].ski + 0x10) = *(undefined4 *)(puVar4 + 0x10);
        uVar5 = *(undefined8 *)(puVar4 + 8);
        *(undefined8 *)psVar6[uVar8].ski = *(undefined8 *)puVar4;
        *(undefined8 *)(psVar6[uVar8].ski + 8) = uVar5;
        puVar10 = puVar4 + 0x18;
        puVar11 = psVar6[uVar8].spki;
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
          puVar10 = puVar10 + (ulong)bVar13 * -0x10 + 8;
          puVar11 = puVar11 + (ulong)bVar13 * -0x10 + 8;
        }
        *(undefined2 *)(psVar6[uVar8].spki + 0x58) = *(undefined2 *)(puVar4 + 0x70);
        psVar6[uVar8].spki[0x5a] = puVar4[0x72];
      }
      ptVar12 = ptVar12->next;
    } while (ptVar12 != (tommy_node_struct *)0x0);
    iVar9 = 0;
  }
LAB_0010489e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_search_by_ski(struct spki_table *spki_table, uint8_t *ski, struct spki_record **result,
			     unsigned int *result_size)
{
	tommy_node *current_node;
	void *tmp;
	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		struct key_entry *current_entry;

		current_entry = (struct key_entry *)current_node->data;

		if (memcmp(current_entry->ski, ski, sizeof(current_entry->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, sizeof(**result) * (*result_size));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(current_entry, *result + (*result_size - 1));
		}
		current_node = current_node->next;
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}